

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmSystemTools::ParseArguments_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmSystemTools *this,char *command)

{
  cmSystemTools cVar1;
  bool bVar2;
  cmSystemTools cVar3;
  cmSystemTools *pcVar4;
  string arg;
  value_type local_50;
  
  bVar2 = false;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cVar3 = *this;
  if (cVar3 != (cmSystemTools)0x2f) {
    cVar1 = this[1];
    if ((cVar1 == (cmSystemTools)0x3a) && (bVar2 = true, this[2] == (cmSystemTools)0x5c)) {
LAB_00126e9b:
      if (cVar3 == (cmSystemTools)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      if (cVar3 == (cmSystemTools)0x5c) {
joined_r0x00126e92:
        if (cVar1 == (cmSystemTools)0x5c) {
          bVar2 = true;
          goto LAB_00126ea3;
        }
      }
      else {
        if ((cVar3 != (cmSystemTools)0x27) && (cVar3 != (cmSystemTools)0x22)) {
          bVar2 = false;
          goto LAB_00126e9b;
        }
        if ((cVar1 != (cmSystemTools)0x2f) && (this[2] == (cmSystemTools)0x3a)) {
          cVar1 = this[3];
          goto joined_r0x00126e92;
        }
      }
      bVar2 = false;
    }
  }
LAB_00126ea3:
LAB_00126eb2:
  while ((cVar3 == (cmSystemTools)0x20 || (cVar3 == (cmSystemTools)0x9))) {
    pcVar4 = this + 1;
    this = this + 1;
    cVar3 = *pcVar4;
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._M_string_length,0x1c0ee8);
  cVar3 = *this;
  if (cVar3 == (cmSystemTools)0x22) {
    while( true ) {
      pcVar4 = this + 1;
      cVar3 = *pcVar4;
      if ((cVar3 == (cmSystemTools)0x0) || (cVar3 == (cmSystemTools)0x22)) break;
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
      this = pcVar4;
    }
    this = this + 2;
    if (cVar3 == (cmSystemTools)0x0) {
      this = pcVar4;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    goto LAB_00126ff7;
  }
  if (cVar3 != (cmSystemTools)0x27) {
    if (cVar3 != (cmSystemTools)0x0) {
      do {
        if (cVar3 == (cmSystemTools)0x5c) {
          if (bVar2) goto LAB_00126f18;
          if (this[1] == (cmSystemTools)0x0) goto LAB_00126f30;
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
          this = this + 2;
        }
        else {
          if (((byte)cVar3 < 0x21) && ((0x100000201U >> ((ulong)(byte)cVar3 & 0x3f) & 1) != 0))
          goto LAB_00126fec;
LAB_00126f18:
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
LAB_00126f30:
          this = this + 1;
        }
        cVar3 = *this;
      } while( true );
    }
    goto LAB_00127002;
  }
  while( true ) {
    pcVar4 = this + 1;
    cVar3 = *pcVar4;
    if ((cVar3 == (cmSystemTools)0x0) || (cVar3 == (cmSystemTools)0x27)) break;
    std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
    this = pcVar4;
  }
  this = this + 2;
  if (cVar3 == (cmSystemTools)0x0) {
    this = pcVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
LAB_00126ff7:
  cVar3 = *this;
  if (cVar3 == (cmSystemTools)0x0) {
LAB_00127002:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
    return __return_storage_ptr__;
  }
  goto LAB_00126eb2;
LAB_00126fec:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
  goto LAB_00126ff7;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const char* command)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  if ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
      (command[0] == '\"' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\'' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\\' && command[1] == '\\'))
    {
    win_path = true;
    }
  // Split the command into an argv array.
  for(const char* c = command; *c;)
    {
    // Skip over whitespace.
    while(*c == ' ' || *c == '\t')
      {
      ++c;
      }
    arg = "";
    if(*c == '"')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '"')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c == '\'')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '\'')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c)
      {
      // Parse an unquoted argument.
      while(*c && *c != ' ' && *c != '\t')
        {
        if(*c == '\\' && !win_path)
          {
          ++c;
          if(*c)
            {
            arg.append(1, *c);
            ++c;
            }
          }
        else
          {
          arg.append(1, *c);
          ++c;
          }
        }
      args.push_back(arg);
      }
    }

  return args;
}